

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

_Bool Curl_cw_out_is_paused(Curl_easy *data)

{
  _Bool _Var1;
  Curl_cwriter *pCVar2;
  
  pCVar2 = Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  if (pCVar2 == (Curl_cwriter *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = (_Bool)(*(byte *)&pCVar2[1].next & 1);
  }
  return _Var1;
}

Assistant:

bool Curl_cw_out_is_paused(struct Curl_easy *data)
{
  struct Curl_cwriter *cw_out;
  struct cw_out_ctx *ctx;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(!cw_out)
    return FALSE;

  ctx = (struct cw_out_ctx *)cw_out;
  return ctx->paused;
}